

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  undefined8 unaff_RBP;
  ulong uVar31;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar51 [16];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  float fVar93;
  undefined4 uVar94;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar102;
  float t1;
  undefined1 auVar103 [16];
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 a0_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vfloat4 a0_3;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  __m128 a_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  __m128 a;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar193;
  float fVar195;
  vfloat4 a0_1;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar210;
  float fVar211;
  vfloat4 a0;
  undefined1 auVar203 [16];
  float fVar212;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_340;
  float local_33c;
  undefined1 local_338 [16];
  long local_320;
  Primitive *local_318;
  ulong local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  RayQueryContext *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar220 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  fVar201 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar74._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar104 = fVar201 * auVar74._16_4_;
  fVar93 = fVar201 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar62 = vpmovsxbd_avx2(auVar36);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar60 = vpmovsxbd_avx2(auVar45);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar67 = vpmovsxbd_avx2(auVar46);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar77 = vpmovsxbd_avx2(auVar47);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar26 * 0xc + 6);
  auVar78 = vpmovsxbd_avx2(auVar41);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar61 = vpmovsxbd_avx2(auVar37);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar68 = vpmovsxbd_avx2(auVar38);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar26 * 0x13 + 6);
  auVar69 = vpmovsxbd_avx2(auVar39);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar26 * 0x14 + 6);
  auVar71 = vpmovsxbd_avx2(auVar40);
  auVar70 = vcvtdq2ps_avx(auVar71);
  auVar132._4_4_ = fVar93;
  auVar132._0_4_ = fVar93;
  auVar132._8_4_ = fVar93;
  auVar132._12_4_ = fVar93;
  auVar132._16_4_ = fVar93;
  auVar132._20_4_ = fVar93;
  auVar132._24_4_ = fVar93;
  auVar132._28_4_ = fVar93;
  auVar226._8_4_ = 1;
  auVar226._0_8_ = 0x100000001;
  auVar226._12_4_ = 1;
  auVar226._16_4_ = 1;
  auVar226._20_4_ = 1;
  auVar226._24_4_ = 1;
  auVar226._28_4_ = 1;
  auVar57 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar59 = ZEXT1632(CONCAT412(fVar201 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar201 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar201 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar93))));
  auVar72 = vpermps_avx2(auVar226,auVar59);
  auVar58 = vpermps_avx512vl(auVar57,auVar59);
  fVar93 = auVar58._0_4_;
  auVar227._0_4_ = fVar93 * auVar67._0_4_;
  fVar194 = auVar58._4_4_;
  auVar227._4_4_ = fVar194 * auVar67._4_4_;
  fVar196 = auVar58._8_4_;
  auVar227._8_4_ = fVar196 * auVar67._8_4_;
  fVar198 = auVar58._12_4_;
  auVar227._12_4_ = fVar198 * auVar67._12_4_;
  fVar199 = auVar58._16_4_;
  auVar227._16_4_ = fVar199 * auVar67._16_4_;
  fVar200 = auVar58._20_4_;
  auVar227._20_4_ = fVar200 * auVar67._20_4_;
  fVar102 = auVar58._24_4_;
  auVar227._28_36_ = in_ZMM4._28_36_;
  auVar227._24_4_ = fVar102 * auVar67._24_4_;
  auVar59._4_4_ = auVar61._4_4_ * fVar194;
  auVar59._0_4_ = auVar61._0_4_ * fVar93;
  auVar59._8_4_ = auVar61._8_4_ * fVar196;
  auVar59._12_4_ = auVar61._12_4_ * fVar198;
  auVar59._16_4_ = auVar61._16_4_ * fVar199;
  auVar59._20_4_ = auVar61._20_4_ * fVar200;
  auVar59._24_4_ = auVar61._24_4_ * fVar102;
  auVar59._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar70._4_4_ * fVar194;
  auVar71._0_4_ = auVar70._0_4_ * fVar93;
  auVar71._8_4_ = auVar70._8_4_ * fVar196;
  auVar71._12_4_ = auVar70._12_4_ * fVar198;
  auVar71._16_4_ = auVar70._16_4_ * fVar199;
  auVar71._20_4_ = auVar70._20_4_ * fVar200;
  auVar71._24_4_ = auVar70._24_4_ * fVar102;
  auVar71._28_4_ = auVar58._28_4_;
  auVar36 = vfmadd231ps_fma(auVar227._0_32_,auVar72,auVar60);
  auVar45 = vfmadd231ps_fma(auVar59,auVar72,auVar78);
  auVar46 = vfmadd231ps_fma(auVar71,auVar69,auVar72);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar132,auVar62);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar132,auVar77);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar68,auVar132);
  auVar216._4_4_ = fVar104;
  auVar216._0_4_ = fVar104;
  auVar216._8_4_ = fVar104;
  auVar216._12_4_ = fVar104;
  auVar216._16_4_ = fVar104;
  auVar216._20_4_ = fVar104;
  auVar216._24_4_ = fVar104;
  auVar216._28_4_ = fVar104;
  auVar72 = ZEXT1632(CONCAT412(fVar201 * auVar74._28_4_,
                               CONCAT48(fVar201 * auVar74._24_4_,
                                        CONCAT44(fVar201 * auVar74._20_4_,fVar104))));
  auVar71 = vpermps_avx2(auVar226,auVar72);
  auVar59 = vpermps_avx512vl(auVar57,auVar72);
  fVar201 = auVar59._0_4_;
  fVar93 = auVar59._4_4_;
  auVar72._4_4_ = fVar93 * auVar67._4_4_;
  auVar72._0_4_ = fVar201 * auVar67._0_4_;
  fVar194 = auVar59._8_4_;
  auVar72._8_4_ = fVar194 * auVar67._8_4_;
  fVar196 = auVar59._12_4_;
  auVar72._12_4_ = fVar196 * auVar67._12_4_;
  fVar198 = auVar59._16_4_;
  auVar72._16_4_ = fVar198 * auVar67._16_4_;
  fVar199 = auVar59._20_4_;
  auVar72._20_4_ = fVar199 * auVar67._20_4_;
  fVar200 = auVar59._24_4_;
  auVar72._24_4_ = fVar200 * auVar67._24_4_;
  auVar72._28_4_ = 1;
  auVar57._4_4_ = auVar61._4_4_ * fVar93;
  auVar57._0_4_ = auVar61._0_4_ * fVar201;
  auVar57._8_4_ = auVar61._8_4_ * fVar194;
  auVar57._12_4_ = auVar61._12_4_ * fVar196;
  auVar57._16_4_ = auVar61._16_4_ * fVar198;
  auVar57._20_4_ = auVar61._20_4_ * fVar199;
  auVar57._24_4_ = auVar61._24_4_ * fVar200;
  auVar57._28_4_ = auVar67._28_4_;
  auVar61._4_4_ = auVar70._4_4_ * fVar93;
  auVar61._0_4_ = auVar70._0_4_ * fVar201;
  auVar61._8_4_ = auVar70._8_4_ * fVar194;
  auVar61._12_4_ = auVar70._12_4_ * fVar196;
  auVar61._16_4_ = auVar70._16_4_ * fVar198;
  auVar61._20_4_ = auVar70._20_4_ * fVar199;
  auVar61._24_4_ = auVar70._24_4_ * fVar200;
  auVar61._28_4_ = auVar59._28_4_;
  auVar47 = vfmadd231ps_fma(auVar72,auVar71,auVar60);
  auVar41 = vfmadd231ps_fma(auVar57,auVar71,auVar78);
  auVar37 = vfmadd231ps_fma(auVar61,auVar71,auVar69);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar216,auVar62);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar216,auVar77);
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar80._16_4_ = 0x7fffffff;
  auVar80._20_4_ = 0x7fffffff;
  auVar80._24_4_ = 0x7fffffff;
  auVar80._28_4_ = 0x7fffffff;
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar216,auVar68);
  auVar62 = vandps_avx(ZEXT1632(auVar36),auVar80);
  auVar121._8_4_ = 0x219392ef;
  auVar121._0_8_ = 0x219392ef219392ef;
  auVar121._12_4_ = 0x219392ef;
  auVar121._16_4_ = 0x219392ef;
  auVar121._20_4_ = 0x219392ef;
  auVar121._24_4_ = 0x219392ef;
  auVar121._28_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar62,auVar121,1);
  bVar34 = (bool)((byte)uVar31 & 1);
  auVar58._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._0_4_;
  bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._4_4_;
  bVar34 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._8_4_;
  bVar34 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._12_4_;
  auVar58._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar58._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar58._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar58._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar45),auVar80);
  uVar31 = vcmpps_avx512vl(auVar62,auVar121,1);
  bVar34 = (bool)((byte)uVar31 & 1);
  auVar73._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._0_4_;
  bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._4_4_;
  bVar34 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._8_4_;
  bVar34 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar46),auVar80);
  uVar31 = vcmpps_avx512vl(auVar62,auVar121,1);
  bVar34 = (bool)((byte)uVar31 & 1);
  auVar62._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._0_4_;
  bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._4_4_;
  bVar34 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._8_4_;
  bVar34 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._12_4_;
  auVar62._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar62._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar62._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar62._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar60 = vrcp14ps_avx512vl(auVar58);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar81._16_4_ = 0x3f800000;
  auVar81._20_4_ = 0x3f800000;
  auVar81._24_4_ = 0x3f800000;
  auVar81._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar58,auVar60,auVar81);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar73);
  auVar45 = vfnmadd213ps_fma(auVar73,auVar60,auVar81);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar62);
  auVar46 = vfnmadd213ps_fma(auVar62,auVar60,auVar81);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar60,auVar60);
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar47));
  auVar68._4_4_ = auVar36._4_4_ * auVar62._4_4_;
  auVar68._0_4_ = auVar36._0_4_ * auVar62._0_4_;
  auVar68._8_4_ = auVar36._8_4_ * auVar62._8_4_;
  auVar68._12_4_ = auVar36._12_4_ * auVar62._12_4_;
  auVar68._16_4_ = auVar62._16_4_ * 0.0;
  auVar68._20_4_ = auVar62._20_4_ * 0.0;
  auVar68._24_4_ = auVar62._24_4_ * 0.0;
  auVar68._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar47));
  auVar79._0_4_ = auVar36._0_4_ * auVar62._0_4_;
  auVar79._4_4_ = auVar36._4_4_ * auVar62._4_4_;
  auVar79._8_4_ = auVar36._8_4_ * auVar62._8_4_;
  auVar79._12_4_ = auVar36._12_4_ * auVar62._12_4_;
  auVar79._16_4_ = auVar62._16_4_ * 0.0;
  auVar79._20_4_ = auVar62._20_4_ * 0.0;
  auVar79._24_4_ = auVar62._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0xe + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar41));
  auVar69._4_4_ = auVar45._4_4_ * auVar62._4_4_;
  auVar69._0_4_ = auVar45._0_4_ * auVar62._0_4_;
  auVar69._8_4_ = auVar45._8_4_ * auVar62._8_4_;
  auVar69._12_4_ = auVar45._12_4_ * auVar62._12_4_;
  auVar69._16_4_ = auVar62._16_4_ * 0.0;
  auVar69._20_4_ = auVar62._20_4_ * 0.0;
  auVar69._24_4_ = auVar62._24_4_ * 0.0;
  auVar69._28_4_ = auVar62._28_4_;
  auVar61 = vpbroadcastd_avx512vl();
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar41));
  auVar76._0_4_ = auVar45._0_4_ * auVar62._0_4_;
  auVar76._4_4_ = auVar45._4_4_ * auVar62._4_4_;
  auVar76._8_4_ = auVar45._8_4_ * auVar62._8_4_;
  auVar76._12_4_ = auVar45._12_4_ * auVar62._12_4_;
  auVar76._16_4_ = auVar62._16_4_ * 0.0;
  auVar76._20_4_ = auVar62._20_4_ * 0.0;
  auVar76._24_4_ = auVar62._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x15 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar37));
  auVar70._4_4_ = auVar62._4_4_ * auVar46._4_4_;
  auVar70._0_4_ = auVar62._0_4_ * auVar46._0_4_;
  auVar70._8_4_ = auVar62._8_4_ * auVar46._8_4_;
  auVar70._12_4_ = auVar62._12_4_ * auVar46._12_4_;
  auVar70._16_4_ = auVar62._16_4_ * 0.0;
  auVar70._20_4_ = auVar62._20_4_ * 0.0;
  auVar70._24_4_ = auVar62._24_4_ * 0.0;
  auVar70._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar37));
  auVar75._0_4_ = auVar46._0_4_ * auVar62._0_4_;
  auVar75._4_4_ = auVar46._4_4_ * auVar62._4_4_;
  auVar75._8_4_ = auVar46._8_4_ * auVar62._8_4_;
  auVar75._12_4_ = auVar46._12_4_ * auVar62._12_4_;
  auVar75._16_4_ = auVar62._16_4_ * 0.0;
  auVar75._20_4_ = auVar62._20_4_ * 0.0;
  auVar75._24_4_ = auVar62._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar62 = vpminsd_avx2(auVar68,auVar79);
  auVar60 = vpminsd_avx2(auVar69,auVar76);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60 = vpminsd_avx2(auVar70,auVar75);
  uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar67._4_4_ = uVar94;
  auVar67._0_4_ = uVar94;
  auVar67._8_4_ = uVar94;
  auVar67._12_4_ = uVar94;
  auVar67._16_4_ = uVar94;
  auVar67._20_4_ = uVar94;
  auVar67._24_4_ = uVar94;
  auVar67._28_4_ = uVar94;
  auVar60 = vmaxps_avx512vl(auVar60,auVar67);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60._8_4_ = 0x3f7ffffa;
  auVar60._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar60._12_4_ = 0x3f7ffffa;
  auVar60._16_4_ = 0x3f7ffffa;
  auVar60._20_4_ = 0x3f7ffffa;
  auVar60._24_4_ = 0x3f7ffffa;
  auVar60._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar62,auVar60);
  auVar62 = vpmaxsd_avx2(auVar68,auVar79);
  auVar60 = vpmaxsd_avx2(auVar69,auVar76);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar60 = vpmaxsd_avx2(auVar70,auVar75);
  fVar201 = (ray->super_RayK<1>).tfar;
  auVar77._4_4_ = fVar201;
  auVar77._0_4_ = fVar201;
  auVar77._8_4_ = fVar201;
  auVar77._12_4_ = fVar201;
  auVar77._16_4_ = fVar201;
  auVar77._20_4_ = fVar201;
  auVar77._24_4_ = fVar201;
  auVar77._28_4_ = fVar201;
  auVar60 = vminps_avx512vl(auVar60,auVar77);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar78._8_4_ = 0x3f800003;
  auVar78._0_8_ = 0x3f8000033f800003;
  auVar78._12_4_ = 0x3f800003;
  auVar78._16_4_ = 0x3f800003;
  auVar78._20_4_ = 0x3f800003;
  auVar78._24_4_ = 0x3f800003;
  auVar78._28_4_ = 0x3f800003;
  auVar62 = vmulps_avx512vl(auVar62,auVar78);
  uVar11 = vcmpps_avx512vl(local_78,auVar62,2);
  uVar12 = vpcmpgtd_avx512vl(auVar61,_DAT_01fb4ba0);
  uVar31 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)(byte)((byte)uVar11 & (byte)uVar12));
  auVar74._16_16_ = auVar62._16_16_;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar238 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar227 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar228 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar229 = ZEXT1664(auVar36);
  auVar237 = ZEXT464(0x3f800000);
LAB_01a280f2:
  if (uVar31 == 0) {
    return;
  }
  lVar28 = 0;
  for (uVar26 = uVar31; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  local_310 = (ulong)*(uint *)(prim + lVar28 * 4 + 6);
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar28 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar36 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar26);
  lVar28 = uVar26 + 1;
  auVar45 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar28);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar46 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar26);
  auVar47 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar28);
  auVar56 = auVar238._0_16_;
  auVar37 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar26),
                       auVar36,auVar56);
  auVar38 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar28),
                       auVar45,auVar56);
  auVar39 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar26 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar46,auVar56);
  auVar40 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar28),
                       auVar47,auVar56);
  auVar64._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar41 = vmulps_avx512vl(auVar45,auVar64._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar38,auVar64._0_16_);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar37,auVar42);
  auVar52._0_4_ = auVar36._0_4_ + auVar41._0_4_;
  auVar52._4_4_ = auVar36._4_4_ + auVar41._4_4_;
  auVar52._8_4_ = auVar36._8_4_ + auVar41._8_4_;
  auVar52._12_4_ = auVar36._12_4_ + auVar41._12_4_;
  auVar50 = auVar227._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar42,auVar37,auVar50);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar36,auVar50);
  auVar41 = vmulps_avx512vl(auVar47,auVar64._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar41,auVar40,auVar64._0_16_);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar43);
  auVar203._0_4_ = auVar46._0_4_ + auVar41._0_4_;
  auVar203._4_4_ = auVar46._4_4_ + auVar41._4_4_;
  auVar203._8_4_ = auVar46._8_4_ + auVar41._8_4_;
  auVar203._12_4_ = auVar46._12_4_ + auVar41._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar43,auVar39,auVar50);
  auVar43 = vfnmadd231ps_avx512vl(auVar41,auVar46,auVar50);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar38,auVar45);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar37,auVar64._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar64._0_16_);
  auVar45 = vmulps_avx512vl(auVar45,auVar50);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar50,auVar38);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar64._0_16_,auVar37);
  auVar38 = vfnmadd231ps_avx512vl(auVar45,auVar64._0_16_,auVar36);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar47);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar39,auVar64._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar36,auVar46,auVar64._0_16_);
  auVar36 = vmulps_avx512vl(auVar47,auVar50);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar50,auVar40);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar64._0_16_,auVar39);
  auVar37 = vfnmadd231ps_avx512vl(auVar36,auVar64._0_16_,auVar46);
  auVar36 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar45 = vshufps_avx(auVar203,auVar203,0xc9);
  fVar104 = auVar42._0_4_;
  auVar135._0_4_ = fVar104 * auVar45._0_4_;
  fVar99 = auVar42._4_4_;
  auVar135._4_4_ = fVar99 * auVar45._4_4_;
  fVar100 = auVar42._8_4_;
  auVar135._8_4_ = fVar100 * auVar45._8_4_;
  fVar101 = auVar42._12_4_;
  auVar135._12_4_ = fVar101 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar135,auVar36,auVar203);
  auVar46 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar153._0_4_ = auVar45._0_4_ * fVar104;
  auVar153._4_4_ = auVar45._4_4_ * fVar99;
  auVar153._8_4_ = auVar45._8_4_ * fVar100;
  auVar153._12_4_ = auVar45._12_4_ * fVar101;
  auVar36 = vfmsub231ps_fma(auVar153,auVar36,auVar43);
  auVar47 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar45 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar201 = auVar38._0_4_;
  auVar162._0_4_ = auVar45._0_4_ * fVar201;
  fVar93 = auVar38._4_4_;
  auVar162._4_4_ = auVar45._4_4_ * fVar93;
  fVar194 = auVar38._8_4_;
  auVar162._8_4_ = auVar45._8_4_ * fVar194;
  fVar196 = auVar38._12_4_;
  auVar162._12_4_ = auVar45._12_4_ * fVar196;
  auVar45 = vfmsub231ps_fma(auVar162,auVar36,auVar41);
  auVar41 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar163._0_4_ = auVar45._0_4_ * fVar201;
  auVar163._4_4_ = auVar45._4_4_ * fVar93;
  auVar163._8_4_ = auVar45._8_4_ * fVar194;
  auVar163._12_4_ = auVar45._12_4_ * fVar196;
  auVar36 = vfmsub231ps_fma(auVar163,auVar36,auVar37);
  auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar46,auVar46,0x7f);
  fVar198 = auVar36._0_4_;
  auVar64._16_16_ = auVar74._16_16_;
  auVar63._4_28_ = auVar64._4_28_;
  auVar63._0_4_ = fVar198;
  auVar45 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
  fVar199 = auVar45._0_4_;
  fVar200 = fVar199 * 1.5 - fVar198 * 0.5 * fVar199 * fVar199 * fVar199;
  auVar45 = vdpps_avx(auVar46,auVar47,0x7f);
  fVar202 = fVar200 * auVar46._0_4_;
  fVar210 = fVar200 * auVar46._4_4_;
  fVar211 = fVar200 * auVar46._8_4_;
  fVar212 = fVar200 * auVar46._12_4_;
  auVar154._0_4_ = fVar198 * auVar47._0_4_;
  auVar154._4_4_ = fVar198 * auVar47._4_4_;
  auVar154._8_4_ = fVar198 * auVar47._8_4_;
  auVar154._12_4_ = fVar198 * auVar47._12_4_;
  fVar198 = auVar45._0_4_;
  auVar136._0_4_ = fVar198 * auVar46._0_4_;
  auVar136._4_4_ = fVar198 * auVar46._4_4_;
  auVar136._8_4_ = fVar198 * auVar46._8_4_;
  auVar136._12_4_ = fVar198 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar154,auVar136);
  auVar45 = vrcp14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar45,ZEXT416(0x40000000));
  fVar198 = auVar45._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar41,auVar41,0x7f);
  fVar199 = auVar36._0_4_;
  auVar66._16_16_ = auVar74._16_16_;
  auVar66._0_16_ = auVar64._0_16_;
  auVar65._4_28_ = auVar66._4_28_;
  auVar65._0_4_ = fVar199;
  auVar45 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  fVar102 = auVar45._0_4_;
  fVar102 = fVar102 * 1.5 - fVar199 * 0.5 * fVar102 * fVar102 * fVar102;
  auVar45 = vdpps_avx(auVar41,auVar37,0x7f);
  fVar182 = fVar102 * auVar41._0_4_;
  fVar193 = fVar102 * auVar41._4_4_;
  fVar195 = fVar102 * auVar41._8_4_;
  fVar197 = fVar102 * auVar41._12_4_;
  auVar123._0_4_ = fVar199 * auVar37._0_4_;
  auVar123._4_4_ = fVar199 * auVar37._4_4_;
  auVar123._8_4_ = fVar199 * auVar37._8_4_;
  auVar123._12_4_ = fVar199 * auVar37._12_4_;
  fVar199 = auVar45._0_4_;
  auVar54._0_4_ = fVar199 * auVar41._0_4_;
  auVar54._4_4_ = fVar199 * auVar41._4_4_;
  auVar54._8_4_ = fVar199 * auVar41._8_4_;
  auVar54._12_4_ = fVar199 * auVar41._12_4_;
  auVar47 = vsubps_avx(auVar123,auVar54);
  auVar45 = vrcp14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar45,ZEXT416(0x40000000));
  fVar199 = auVar45._0_4_ * auVar36._0_4_;
  auVar36 = vshufps_avx(auVar52,auVar52,0xff);
  auVar145._0_4_ = fVar202 * auVar36._0_4_;
  auVar145._4_4_ = fVar210 * auVar36._4_4_;
  auVar145._8_4_ = fVar211 * auVar36._8_4_;
  auVar145._12_4_ = fVar212 * auVar36._12_4_;
  local_1a8 = vsubps_avx(auVar52,auVar145);
  auVar45 = vshufps_avx(auVar42,auVar42,0xff);
  auVar124._0_4_ = auVar45._0_4_ * fVar202 + auVar36._0_4_ * fVar200 * fVar198 * auVar46._0_4_;
  auVar124._4_4_ = auVar45._4_4_ * fVar210 + auVar36._4_4_ * fVar200 * fVar198 * auVar46._4_4_;
  auVar124._8_4_ = auVar45._8_4_ * fVar211 + auVar36._8_4_ * fVar200 * fVar198 * auVar46._8_4_;
  auVar124._12_4_ = auVar45._12_4_ * fVar212 + auVar36._12_4_ * fVar200 * fVar198 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar42,auVar124);
  local_1b8._0_4_ = auVar52._0_4_ + auVar145._0_4_;
  local_1b8._4_4_ = auVar52._4_4_ + auVar145._4_4_;
  fStack_1b0 = auVar52._8_4_ + auVar145._8_4_;
  fStack_1ac = auVar52._12_4_ + auVar145._12_4_;
  auVar43._0_4_ = fVar104 + auVar124._0_4_;
  auVar43._4_4_ = fVar99 + auVar124._4_4_;
  auVar43._8_4_ = fVar100 + auVar124._8_4_;
  auVar43._12_4_ = fVar101 + auVar124._12_4_;
  auVar36 = vshufps_avx(auVar44,auVar44,0xff);
  auVar125._0_4_ = fVar182 * auVar36._0_4_;
  auVar125._4_4_ = fVar193 * auVar36._4_4_;
  auVar125._8_4_ = fVar195 * auVar36._8_4_;
  auVar125._12_4_ = fVar197 * auVar36._12_4_;
  local_1c8 = vsubps_avx(auVar44,auVar125);
  auVar45 = vshufps_avx(auVar38,auVar38,0xff);
  auVar50._0_4_ = fVar182 * auVar45._0_4_ + auVar36._0_4_ * fVar102 * auVar47._0_4_ * fVar199;
  auVar50._4_4_ = fVar193 * auVar45._4_4_ + auVar36._4_4_ * fVar102 * auVar47._4_4_ * fVar199;
  auVar50._8_4_ = fVar195 * auVar45._8_4_ + auVar36._8_4_ * fVar102 * auVar47._8_4_ * fVar199;
  auVar50._12_4_ = fVar197 * auVar45._12_4_ + auVar36._12_4_ * fVar102 * auVar47._12_4_ * fVar199;
  auVar36 = vsubps_avx(auVar38,auVar50);
  _local_1d8 = vaddps_avx512vl(auVar44,auVar125);
  auVar51._0_4_ = fVar201 + auVar50._0_4_;
  auVar51._4_4_ = fVar93 + auVar50._4_4_;
  auVar51._8_4_ = fVar194 + auVar50._8_4_;
  auVar51._12_4_ = fVar196 + auVar50._12_4_;
  auVar45 = vmulps_avx512vl(auVar46,auVar56);
  local_1e8 = vaddps_avx512vl(local_1a8,auVar45);
  auVar36 = vmulps_avx512vl(auVar36,auVar56);
  local_1f8 = vsubps_avx512vl(local_1c8,auVar36);
  auVar36 = vmulps_avx512vl(auVar43,auVar56);
  _local_208 = vaddps_avx512vl(_local_1b8,auVar36);
  auVar36 = vmulps_avx512vl(auVar51,auVar56);
  _local_218 = vsubps_avx512vl(_local_1d8,auVar36);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar45 = vsubps_avx(local_1a8,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar56._4_4_ = uVar94;
  auVar56._0_4_ = uVar94;
  auVar56._8_4_ = uVar94;
  auVar56._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  fVar201 = (pre->ray_space).vz.field_0.m128[0];
  fVar93 = (pre->ray_space).vz.field_0.m128[1];
  fVar194 = (pre->ray_space).vz.field_0.m128[2];
  fVar196 = (pre->ray_space).vz.field_0.m128[3];
  auVar44._0_4_ = fVar201 * auVar45._0_4_;
  auVar44._4_4_ = fVar93 * auVar45._4_4_;
  auVar44._8_4_ = fVar194 * auVar45._8_4_;
  auVar44._12_4_ = fVar196 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar36);
  auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar56);
  auVar45 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar49._4_4_ = uVar94;
  auVar49._0_4_ = uVar94;
  auVar49._8_4_ = uVar94;
  auVar49._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar48._0_4_ = fVar201 * auVar45._0_4_;
  auVar48._4_4_ = fVar93 * auVar45._4_4_;
  auVar48._8_4_ = fVar194 * auVar45._8_4_;
  auVar48._12_4_ = fVar196 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar4,auVar36);
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar49);
  auVar45 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar137._4_4_ = uVar94;
  auVar137._0_4_ = uVar94;
  auVar137._8_4_ = uVar94;
  auVar137._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar53._0_4_ = fVar201 * auVar45._0_4_;
  auVar53._4_4_ = fVar93 * auVar45._4_4_;
  auVar53._8_4_ = fVar194 * auVar45._8_4_;
  auVar53._12_4_ = fVar196 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar4,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar137);
  auVar45 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar155._4_4_ = uVar94;
  auVar155._0_4_ = uVar94;
  auVar155._8_4_ = uVar94;
  auVar155._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar138._0_4_ = fVar201 * auVar45._0_4_;
  auVar138._4_4_ = fVar93 * auVar45._4_4_;
  auVar138._8_4_ = fVar194 * auVar45._8_4_;
  auVar138._12_4_ = fVar196 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar4,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar155);
  auVar45 = vsubps_avx(_local_1b8,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar164._4_4_ = uVar94;
  auVar164._0_4_ = uVar94;
  auVar164._8_4_ = uVar94;
  auVar164._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar156._0_4_ = auVar45._0_4_ * fVar201;
  auVar156._4_4_ = auVar45._4_4_ * fVar93;
  auVar156._8_4_ = auVar45._8_4_ * fVar194;
  auVar156._12_4_ = auVar45._12_4_ * fVar196;
  auVar36 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar4,auVar36);
  auVar40 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar164);
  auVar45 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar175._4_4_ = uVar94;
  auVar175._0_4_ = uVar94;
  auVar175._8_4_ = uVar94;
  auVar175._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar165._0_4_ = auVar45._0_4_ * fVar201;
  auVar165._4_4_ = auVar45._4_4_ * fVar93;
  auVar165._8_4_ = auVar45._8_4_ * fVar194;
  auVar165._12_4_ = auVar45._12_4_ * fVar196;
  auVar36 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar4,auVar36);
  auVar74._16_16_ = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar175);
  auVar45 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar183._4_4_ = uVar94;
  auVar183._0_4_ = uVar94;
  auVar183._8_4_ = uVar94;
  auVar183._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar176._0_4_ = auVar45._0_4_ * fVar201;
  auVar176._4_4_ = auVar45._4_4_ * fVar93;
  auVar176._8_4_ = auVar45._8_4_ * fVar194;
  auVar176._12_4_ = auVar45._12_4_ * fVar196;
  auVar36 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar4,auVar36);
  auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar183);
  auVar45 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar2);
  uVar94 = auVar45._0_4_;
  auVar184._4_4_ = uVar94;
  auVar184._0_4_ = uVar94;
  auVar184._8_4_ = uVar94;
  auVar184._12_4_ = uVar94;
  auVar36 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar55._0_4_ = fVar201 * auVar45._0_4_;
  auVar55._4_4_ = fVar93 * auVar45._4_4_;
  auVar55._8_4_ = fVar194 * auVar45._8_4_;
  auVar55._12_4_ = fVar196 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar36);
  auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar184);
  local_308 = vmovlhps_avx512f(auVar41,auVar40);
  auVar234 = ZEXT1664(local_308);
  local_268 = vmovlhps_avx(auVar37,auVar74._16_16_);
  local_278 = vmovlhps_avx512f(auVar38,auVar42);
  _local_108 = vmovlhps_avx512f(auVar39,auVar43);
  auVar36 = vminps_avx512vl(local_308,local_268);
  auVar46 = vmaxps_avx512vl(local_308,local_268);
  auVar45 = vminps_avx512vl(local_278,_local_108);
  auVar45 = vminps_avx(auVar36,auVar45);
  auVar36 = vmaxps_avx512vl(local_278,_local_108);
  auVar36 = vmaxps_avx(auVar46,auVar36);
  auVar46 = vshufpd_avx(auVar45,auVar45,3);
  auVar47 = vshufpd_avx(auVar36,auVar36,3);
  auVar45 = vminps_avx(auVar45,auVar46);
  auVar36 = vmaxps_avx(auVar36,auVar47);
  auVar45 = vandps_avx512vl(auVar45,auVar228._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar228._0_16_);
  auVar36 = vmaxps_avx(auVar45,auVar36);
  auVar45 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar45,auVar36);
  local_320 = uVar31 + 0xff;
  local_288._8_8_ = auVar41._0_8_;
  local_288._0_8_ = auVar41._0_8_;
  local_298._8_8_ = auVar37._0_8_;
  local_298._0_8_ = auVar37._0_8_;
  local_2a8 = vmovddup_avx512vl(auVar38);
  local_2b8 = vmovddup_avx512vl(auVar39);
  register0x00001348 = auVar40._0_8_;
  local_2c8 = auVar40._0_8_;
  register0x00001388 = auVar74._16_8_;
  local_2d8 = auVar74._16_8_;
  register0x00001408 = auVar42._0_8_;
  local_2e8 = auVar42._0_8_;
  register0x00001448 = auVar43._0_8_;
  local_2f8 = auVar43._0_8_;
  local_118 = ZEXT416((uint)(auVar36._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_118);
  auVar36 = vxorps_avx512vl(local_b8._0_16_,auVar229._0_16_);
  local_d8 = vbroadcastss_avx512vl(auVar36);
  local_338 = vsubps_avx512vl(local_268,local_308);
  local_e8 = vsubps_avx512vl(local_278,local_268);
  local_f8 = vsubps_avx512vl(_local_108,local_278);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  uVar26 = 0;
  auVar36 = ZEXT816(0x3f80000000000000);
  local_318 = prim;
  auVar42 = auVar36;
LAB_01a28767:
  auVar236 = ZEXT3264(local_b8);
  auVar45 = vshufps_avx(auVar42,auVar42,0x50);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = 0x3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar220._16_4_ = 0x3f800000;
  auVar220._0_16_ = auVar217;
  auVar220._20_4_ = 0x3f800000;
  auVar220._24_4_ = 0x3f800000;
  auVar220._28_4_ = 0x3f800000;
  auVar46 = vsubps_avx(auVar217,auVar45);
  fVar201 = auVar45._0_4_;
  auVar118._0_4_ = local_2c8._0_4_ * fVar201;
  fVar93 = auVar45._4_4_;
  auVar118._4_4_ = local_2c8._4_4_ * fVar93;
  fVar194 = auVar45._8_4_;
  auVar118._8_4_ = local_2c8._8_4_ * fVar194;
  fVar196 = auVar45._12_4_;
  auVar118._12_4_ = local_2c8._12_4_ * fVar196;
  auVar126._0_4_ = local_2d8._0_4_ * fVar201;
  auVar126._4_4_ = local_2d8._4_4_ * fVar93;
  auVar126._8_4_ = local_2d8._8_4_ * fVar194;
  auVar126._12_4_ = local_2d8._12_4_ * fVar196;
  auVar139._0_4_ = local_2e8._0_4_ * fVar201;
  auVar139._4_4_ = local_2e8._4_4_ * fVar93;
  auVar139._8_4_ = local_2e8._8_4_ * fVar194;
  auVar139._12_4_ = local_2e8._12_4_ * fVar196;
  auVar105._0_4_ = local_2f8._0_4_ * fVar201;
  auVar105._4_4_ = local_2f8._4_4_ * fVar93;
  auVar105._8_4_ = local_2f8._8_4_ * fVar194;
  auVar105._12_4_ = local_2f8._12_4_ * fVar196;
  auVar47 = vfmadd231ps_fma(auVar118,auVar46,local_288);
  auVar41 = vfmadd231ps_fma(auVar126,auVar46,local_298);
  auVar37 = vfmadd231ps_avx512vl(auVar139,auVar46,local_2a8);
  auVar46 = vfmadd231ps_avx512vl(auVar105,local_2b8,auVar46);
  auVar45 = vmovshdup_avx(auVar36);
  fVar93 = auVar36._0_4_;
  fVar201 = (auVar45._0_4_ - fVar93) * 0.04761905;
  auVar161._4_4_ = fVar93;
  auVar161._0_4_ = fVar93;
  auVar161._8_4_ = fVar93;
  auVar161._12_4_ = fVar93;
  auVar161._16_4_ = fVar93;
  auVar161._20_4_ = fVar93;
  auVar161._24_4_ = fVar93;
  auVar161._28_4_ = fVar93;
  auVar116._0_8_ = auVar45._0_8_;
  auVar116._8_8_ = auVar116._0_8_;
  auVar116._16_8_ = auVar116._0_8_;
  auVar116._24_8_ = auVar116._0_8_;
  auVar62 = vsubps_avx(auVar116,auVar161);
  uVar94 = auVar47._0_4_;
  auVar117._4_4_ = uVar94;
  auVar117._0_4_ = uVar94;
  auVar117._8_4_ = uVar94;
  auVar117._12_4_ = uVar94;
  auVar117._16_4_ = uVar94;
  auVar117._20_4_ = uVar94;
  auVar117._24_4_ = uVar94;
  auVar117._28_4_ = uVar94;
  auVar179._8_4_ = 1;
  auVar179._0_8_ = 0x100000001;
  auVar179._12_4_ = 1;
  auVar179._16_4_ = 1;
  auVar179._20_4_ = 1;
  auVar179._24_4_ = 1;
  auVar179._28_4_ = 1;
  auVar77 = ZEXT1632(auVar47);
  auVar60 = vpermps_avx2(auVar179,auVar77);
  auVar67 = vbroadcastss_avx512vl(auVar41);
  auVar78 = ZEXT1632(auVar41);
  auVar61 = vpermps_avx512vl(auVar179,auVar78);
  auVar68 = vbroadcastss_avx512vl(auVar37);
  auVar75 = ZEXT1632(auVar37);
  auVar69 = vpermps_avx512vl(auVar179,auVar75);
  auVar70 = vbroadcastss_avx512vl(auVar46);
  auVar74 = ZEXT1632(auVar46);
  auVar71 = vpermps_avx512vl(auVar179,auVar74);
  auVar180._4_4_ = fVar201;
  auVar180._0_4_ = fVar201;
  auVar180._8_4_ = fVar201;
  auVar180._12_4_ = fVar201;
  auVar180._16_4_ = fVar201;
  auVar180._20_4_ = fVar201;
  auVar180._24_4_ = fVar201;
  auVar180._28_4_ = fVar201;
  auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar59 = vpermps_avx512vl(auVar72,auVar77);
  auVar152._8_4_ = 3;
  auVar152._0_8_ = 0x300000003;
  auVar152._12_4_ = 3;
  auVar152._16_4_ = 3;
  auVar152._20_4_ = 3;
  auVar152._24_4_ = 3;
  auVar152._28_4_ = 3;
  auVar57 = vpermps_avx512vl(auVar152,auVar77);
  auVar58 = vpermps_avx512vl(auVar72,auVar78);
  auVar77 = vpermps_avx2(auVar152,auVar78);
  auVar73 = vpermps_avx512vl(auVar72,auVar75);
  auVar78 = vpermps_avx2(auVar152,auVar75);
  auVar72 = vpermps_avx512vl(auVar72,auVar74);
  auVar74 = vpermps_avx512vl(auVar152,auVar74);
  auVar45 = vfmadd132ps_fma(auVar62,auVar161,_DAT_01f7b040);
  auVar62 = vsubps_avx(auVar220,ZEXT1632(auVar45));
  auVar75 = vmulps_avx512vl(auVar67,ZEXT1632(auVar45));
  auVar79 = ZEXT1632(auVar45);
  auVar76 = vmulps_avx512vl(auVar61,auVar79);
  auVar46 = vfmadd231ps_fma(auVar75,auVar62,auVar117);
  auVar47 = vfmadd231ps_fma(auVar76,auVar62,auVar60);
  auVar75 = vmulps_avx512vl(auVar68,auVar79);
  auVar76 = vmulps_avx512vl(auVar69,auVar79);
  auVar67 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar67);
  auVar61 = vfmadd231ps_avx512vl(auVar76,auVar62,auVar61);
  auVar75 = vmulps_avx512vl(auVar70,auVar79);
  auVar76 = ZEXT1632(auVar45);
  auVar71 = vmulps_avx512vl(auVar71,auVar76);
  auVar68 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar68);
  auVar69 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar69);
  fVar194 = auVar45._0_4_;
  fVar196 = auVar45._4_4_;
  auVar17._4_4_ = fVar196 * auVar67._4_4_;
  auVar17._0_4_ = fVar194 * auVar67._0_4_;
  fVar198 = auVar45._8_4_;
  auVar17._8_4_ = fVar198 * auVar67._8_4_;
  fVar199 = auVar45._12_4_;
  auVar17._12_4_ = fVar199 * auVar67._12_4_;
  auVar17._16_4_ = auVar67._16_4_ * 0.0;
  auVar17._20_4_ = auVar67._20_4_ * 0.0;
  auVar17._24_4_ = auVar67._24_4_ * 0.0;
  auVar17._28_4_ = fVar93;
  auVar18._4_4_ = fVar196 * auVar61._4_4_;
  auVar18._0_4_ = fVar194 * auVar61._0_4_;
  auVar18._8_4_ = fVar198 * auVar61._8_4_;
  auVar18._12_4_ = fVar199 * auVar61._12_4_;
  auVar18._16_4_ = auVar61._16_4_ * 0.0;
  auVar18._20_4_ = auVar61._20_4_ * 0.0;
  auVar18._24_4_ = auVar61._24_4_ * 0.0;
  auVar18._28_4_ = auVar60._28_4_;
  auVar46 = vfmadd231ps_fma(auVar17,auVar62,ZEXT1632(auVar46));
  auVar47 = vfmadd231ps_fma(auVar18,auVar62,ZEXT1632(auVar47));
  auVar110._0_4_ = fVar194 * auVar68._0_4_;
  auVar110._4_4_ = fVar196 * auVar68._4_4_;
  auVar110._8_4_ = fVar198 * auVar68._8_4_;
  auVar110._12_4_ = fVar199 * auVar68._12_4_;
  auVar110._16_4_ = auVar68._16_4_ * 0.0;
  auVar110._20_4_ = auVar68._20_4_ * 0.0;
  auVar110._24_4_ = auVar68._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar19._4_4_ = fVar196 * auVar69._4_4_;
  auVar19._0_4_ = fVar194 * auVar69._0_4_;
  auVar19._8_4_ = fVar198 * auVar69._8_4_;
  auVar19._12_4_ = fVar199 * auVar69._12_4_;
  auVar19._16_4_ = auVar69._16_4_ * 0.0;
  auVar19._20_4_ = auVar69._20_4_ * 0.0;
  auVar19._24_4_ = auVar69._24_4_ * 0.0;
  auVar19._28_4_ = auVar68._28_4_;
  auVar41 = vfmadd231ps_fma(auVar110,auVar62,auVar67);
  auVar37 = vfmadd231ps_fma(auVar19,auVar62,auVar61);
  auVar20._28_4_ = auVar61._28_4_;
  auVar20._0_28_ =
       ZEXT1628(CONCAT412(fVar199 * auVar37._12_4_,
                          CONCAT48(fVar198 * auVar37._8_4_,
                                   CONCAT44(fVar196 * auVar37._4_4_,fVar194 * auVar37._0_4_))));
  auVar38 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar199 * auVar41._12_4_,
                                               CONCAT48(fVar198 * auVar41._8_4_,
                                                        CONCAT44(fVar196 * auVar41._4_4_,
                                                                 fVar194 * auVar41._0_4_)))),auVar62
                            ,ZEXT1632(auVar46));
  auVar39 = vfmadd231ps_fma(auVar20,auVar62,ZEXT1632(auVar47));
  auVar60 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar46));
  auVar67 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar47));
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar60 = vmulps_avx512vl(auVar60,auVar61);
  auVar67 = vmulps_avx512vl(auVar67,auVar61);
  auVar174._0_4_ = fVar201 * auVar60._0_4_;
  auVar174._4_4_ = fVar201 * auVar60._4_4_;
  auVar174._8_4_ = fVar201 * auVar60._8_4_;
  auVar174._12_4_ = fVar201 * auVar60._12_4_;
  auVar174._16_4_ = fVar201 * auVar60._16_4_;
  auVar174._20_4_ = fVar201 * auVar60._20_4_;
  auVar174._24_4_ = fVar201 * auVar60._24_4_;
  auVar174._28_4_ = 0;
  auVar60 = vmulps_avx512vl(auVar180,auVar67);
  auVar47 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
  auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_01fb9fc0,ZEXT1632(auVar47));
  auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01fb9fc0,ZEXT1632(auVar47));
  auVar111._0_4_ = auVar174._0_4_ + auVar38._0_4_;
  auVar111._4_4_ = auVar174._4_4_ + auVar38._4_4_;
  auVar111._8_4_ = auVar174._8_4_ + auVar38._8_4_;
  auVar111._12_4_ = auVar174._12_4_ + auVar38._12_4_;
  auVar111._16_4_ = auVar174._16_4_ + 0.0;
  auVar111._20_4_ = auVar174._20_4_ + 0.0;
  auVar111._24_4_ = auVar174._24_4_ + 0.0;
  auVar111._28_4_ = 0;
  auVar79 = ZEXT1632(auVar47);
  auVar69 = vpermt2ps_avx512vl(auVar174,_DAT_01fb9fc0,auVar79);
  auVar70 = vaddps_avx512vl(ZEXT1632(auVar39),auVar60);
  auVar71 = vpermt2ps_avx512vl(auVar60,_DAT_01fb9fc0,auVar79);
  auVar60 = vsubps_avx(auVar67,auVar69);
  auVar69 = vsubps_avx512vl(auVar68,auVar71);
  auVar71 = vmulps_avx512vl(auVar58,auVar76);
  auVar75 = vmulps_avx512vl(auVar77,auVar76);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar59);
  auVar59 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar57);
  auVar57 = vmulps_avx512vl(auVar73,auVar76);
  auVar75 = vmulps_avx512vl(auVar78,auVar76);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar58);
  auVar77 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar77);
  auVar72 = vmulps_avx512vl(auVar72,auVar76);
  auVar58 = vmulps_avx512vl(auVar74,auVar76);
  auVar46 = vfmadd231ps_fma(auVar72,auVar62,auVar73);
  auVar72 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar78);
  auVar58 = vmulps_avx512vl(auVar76,auVar57);
  auVar74 = ZEXT1632(auVar45);
  auVar73 = vmulps_avx512vl(auVar74,auVar77);
  auVar71 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar71);
  auVar59 = vfmadd231ps_avx512vl(auVar73,auVar62,auVar59);
  auVar72 = vmulps_avx512vl(auVar74,auVar72);
  auVar57 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar199 * auVar46._12_4_,
                                          CONCAT48(fVar198 * auVar46._8_4_,
                                                   CONCAT44(fVar196 * auVar46._4_4_,
                                                            fVar194 * auVar46._0_4_)))),auVar62,
                       auVar57);
  auVar77 = vfmadd231ps_avx512vl(auVar72,auVar62,auVar77);
  auVar21._4_4_ = fVar196 * auVar57._4_4_;
  auVar21._0_4_ = fVar194 * auVar57._0_4_;
  auVar21._8_4_ = fVar198 * auVar57._8_4_;
  auVar21._12_4_ = fVar199 * auVar57._12_4_;
  auVar21._16_4_ = auVar57._16_4_ * 0.0;
  auVar21._20_4_ = auVar57._20_4_ * 0.0;
  auVar21._24_4_ = auVar57._24_4_ * 0.0;
  auVar21._28_4_ = auVar78._28_4_;
  auVar78 = vmulps_avx512vl(auVar74,auVar77);
  auVar72 = vfmadd231ps_avx512vl(auVar21,auVar62,auVar71);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar59,auVar62);
  auVar62 = vsubps_avx512vl(auVar57,auVar71);
  auVar77 = vsubps_avx512vl(auVar77,auVar59);
  auVar62 = vmulps_avx512vl(auVar62,auVar61);
  auVar77 = vmulps_avx512vl(auVar77,auVar61);
  fVar93 = fVar201 * auVar62._0_4_;
  fVar194 = fVar201 * auVar62._4_4_;
  auVar22._4_4_ = fVar194;
  auVar22._0_4_ = fVar93;
  fVar196 = fVar201 * auVar62._8_4_;
  auVar22._8_4_ = fVar196;
  fVar198 = fVar201 * auVar62._12_4_;
  auVar22._12_4_ = fVar198;
  fVar199 = fVar201 * auVar62._16_4_;
  auVar22._16_4_ = fVar199;
  fVar200 = fVar201 * auVar62._20_4_;
  auVar22._20_4_ = fVar200;
  fVar201 = fVar201 * auVar62._24_4_;
  auVar22._24_4_ = fVar201;
  auVar22._28_4_ = auVar62._28_4_;
  auVar77 = vmulps_avx512vl(auVar180,auVar77);
  auVar61 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar79);
  auVar71 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,auVar79);
  auVar181._0_4_ = auVar72._0_4_ + fVar93;
  auVar181._4_4_ = auVar72._4_4_ + fVar194;
  auVar181._8_4_ = auVar72._8_4_ + fVar196;
  auVar181._12_4_ = auVar72._12_4_ + fVar198;
  auVar181._16_4_ = auVar72._16_4_ + fVar199;
  auVar181._20_4_ = auVar72._20_4_ + fVar200;
  auVar181._24_4_ = auVar72._24_4_ + fVar201;
  auVar181._28_4_ = auVar72._28_4_ + auVar62._28_4_;
  auVar62 = vpermt2ps_avx512vl(auVar22,_DAT_01fb9fc0,ZEXT1632(auVar47));
  auVar59 = vaddps_avx512vl(auVar78,auVar77);
  auVar77 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,ZEXT1632(auVar47));
  auVar62 = vsubps_avx(auVar61,auVar62);
  auVar77 = vsubps_avx512vl(auVar71,auVar77);
  in_ZMM17 = ZEXT3264(auVar77);
  auVar121 = ZEXT1632(auVar38);
  auVar57 = vsubps_avx512vl(auVar72,auVar121);
  auVar132 = ZEXT1632(auVar39);
  auVar58 = vsubps_avx512vl(auVar78,auVar132);
  auVar73 = vsubps_avx512vl(auVar61,auVar67);
  auVar57 = vaddps_avx512vl(auVar57,auVar73);
  auVar73 = vsubps_avx512vl(auVar71,auVar68);
  auVar58 = vaddps_avx512vl(auVar58,auVar73);
  auVar73 = vmulps_avx512vl(auVar132,auVar57);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar121,auVar58);
  auVar74 = vmulps_avx512vl(auVar70,auVar57);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar111,auVar58);
  auVar75 = vmulps_avx512vl(auVar69,auVar57);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar60,auVar58);
  auVar76 = vmulps_avx512vl(auVar68,auVar57);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar67,auVar58);
  auVar79 = vmulps_avx512vl(auVar78,auVar57);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar72,auVar58);
  auVar80 = vmulps_avx512vl(auVar59,auVar57);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar181,auVar58);
  auVar81 = vmulps_avx512vl(auVar77,auVar57);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar62,auVar58);
  auVar57 = vmulps_avx512vl(auVar71,auVar57);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar61,auVar58);
  auVar58 = vminps_avx512vl(auVar73,auVar74);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar75,auVar76);
  auVar58 = vminps_avx512vl(auVar58,auVar74);
  auVar74 = vmaxps_avx512vl(auVar75,auVar76);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar79,auVar80);
  auVar75 = vmaxps_avx512vl(auVar79,auVar80);
  auVar76 = vminps_avx512vl(auVar81,auVar57);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar58 = vminps_avx512vl(auVar58,auVar74);
  auVar57 = vmaxps_avx512vl(auVar81,auVar57);
  auVar57 = vmaxps_avx512vl(auVar75,auVar57);
  auVar57 = vmaxps_avx512vl(auVar73,auVar57);
  uVar11 = vcmpps_avx512vl(auVar58,local_b8,2);
  uVar12 = vcmpps_avx512vl(auVar57,local_d8,5);
  bVar24 = (byte)uVar11 & (byte)uVar12 & 0x7f;
  if (bVar24 != 0) {
    auVar57 = vsubps_avx512vl(auVar67,auVar121);
    auVar58 = vsubps_avx512vl(auVar68,auVar132);
    auVar73 = vsubps_avx512vl(auVar61,auVar72);
    auVar57 = vaddps_avx512vl(auVar57,auVar73);
    auVar73 = vsubps_avx512vl(auVar71,auVar78);
    auVar58 = vaddps_avx512vl(auVar58,auVar73);
    auVar73 = vmulps_avx512vl(auVar132,auVar57);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar58,auVar121);
    auVar70 = vmulps_avx512vl(auVar70,auVar57);
    auVar70 = vfnmadd213ps_avx512vl(auVar111,auVar58,auVar70);
    auVar69 = vmulps_avx512vl(auVar69,auVar57);
    auVar69 = vfnmadd213ps_avx512vl(auVar60,auVar58,auVar69);
    auVar60 = vmulps_avx512vl(auVar68,auVar57);
    auVar68 = vfnmadd231ps_avx512vl(auVar60,auVar58,auVar67);
    auVar60 = vmulps_avx512vl(auVar78,auVar57);
    auVar78 = vfnmadd231ps_avx512vl(auVar60,auVar58,auVar72);
    auVar60 = vmulps_avx512vl(auVar59,auVar57);
    auVar72 = vfnmadd213ps_avx512vl(auVar181,auVar58,auVar60);
    auVar60 = vmulps_avx512vl(auVar77,auVar57);
    auVar59 = vfnmadd213ps_avx512vl(auVar62,auVar58,auVar60);
    auVar62 = vmulps_avx512vl(auVar71,auVar57);
    auVar61 = vfnmadd231ps_avx512vl(auVar62,auVar61,auVar58);
    auVar60 = vminps_avx(auVar73,auVar70);
    auVar62 = vmaxps_avx(auVar73,auVar70);
    auVar67 = vminps_avx(auVar69,auVar68);
    auVar67 = vminps_avx(auVar60,auVar67);
    auVar60 = vmaxps_avx(auVar69,auVar68);
    auVar62 = vmaxps_avx(auVar62,auVar60);
    auVar77 = vminps_avx(auVar78,auVar72);
    auVar60 = vmaxps_avx(auVar78,auVar72);
    auVar78 = vminps_avx(auVar59,auVar61);
    auVar77 = vminps_avx(auVar77,auVar78);
    auVar77 = vminps_avx(auVar67,auVar77);
    auVar67 = vmaxps_avx(auVar59,auVar61);
    auVar60 = vmaxps_avx(auVar60,auVar67);
    auVar62 = vmaxps_avx(auVar62,auVar60);
    uVar11 = vcmpps_avx512vl(auVar62,local_d8,5);
    uVar12 = vcmpps_avx512vl(auVar77,local_b8,2);
    bVar24 = bVar24 & (byte)uVar11 & (byte)uVar12;
    if (bVar24 != 0) {
      auStack_198[uVar26] = (uint)bVar24;
      uVar11 = vmovlps_avx(auVar36);
      (&uStack_98)[uVar26] = uVar11;
      uVar1 = vmovlps_avx(auVar42);
      auStack_58[uVar26] = uVar1;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
  }
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar227 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar228 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar229 = ZEXT1664(auVar36);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar230 = ZEXT3264(auVar62);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar231 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar232 = ZEXT1664(auVar36);
  auVar233 = ZEXT3264(_DAT_01fb9fe0);
  auVar74._16_16_ = DAT_01fb9fe0._16_16_;
  auVar235 = ZEXT1664(local_338);
LAB_01a28c64:
  do {
    do {
      do {
        auVar45 = auVar227._0_16_;
        if ((int)uVar26 == 0) {
          fVar201 = (ray->super_RayK<1>).tfar;
          auVar16._4_4_ = fVar201;
          auVar16._0_4_ = fVar201;
          auVar16._8_4_ = fVar201;
          auVar16._12_4_ = fVar201;
          auVar16._16_4_ = fVar201;
          auVar16._20_4_ = fVar201;
          auVar16._24_4_ = fVar201;
          auVar16._28_4_ = fVar201;
          uVar11 = vcmpps_avx512vl(local_78,auVar16,2);
          uVar31 = (ulong)((uint)uVar31 & (uint)local_320 & (uint)uVar11);
          prim = local_318;
          goto LAB_01a280f2;
        }
        uVar25 = (int)uVar26 - 1;
        uVar27 = (ulong)uVar25;
        uVar6 = auStack_198[uVar27];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auStack_58[uVar27];
        uVar1 = 0;
        for (uVar30 = (ulong)uVar6; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar29 = uVar6 - 1 & uVar6;
        bVar34 = uVar29 == 0;
        auStack_198[uVar27] = uVar29;
        if (bVar34) {
          uVar26 = (ulong)uVar25;
        }
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar1;
        auVar36 = vpunpcklqdq_avx(auVar95,ZEXT416((int)uVar1 + 1));
        auVar36 = vcvtqq2ps_avx512vl(auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar231._0_16_);
        uVar94 = *(undefined4 *)((long)&uStack_98 + uVar27 * 8 + 4);
        auVar13._4_4_ = uVar94;
        auVar13._0_4_ = uVar94;
        auVar13._8_4_ = uVar94;
        auVar13._12_4_ = uVar94;
        auVar46 = vmulps_avx512vl(auVar36,auVar13);
        auVar47 = auVar232._0_16_;
        auVar36 = vsubps_avx512vl(auVar47,auVar36);
        uVar94 = *(undefined4 *)(&uStack_98 + uVar27);
        auVar14._4_4_ = uVar94;
        auVar14._0_4_ = uVar94;
        auVar14._8_4_ = uVar94;
        auVar14._12_4_ = uVar94;
        auVar36 = vfmadd231ps_avx512vl(auVar46,auVar36,auVar14);
        auVar46 = vmovshdup_avx(auVar36);
        fVar201 = auVar46._0_4_ - auVar36._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar201));
        if (uVar6 == 0 || bVar34) goto LAB_01a28767;
        auVar46 = vshufps_avx(auVar42,auVar42,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar201));
        auVar38 = vsubps_avx512vl(auVar47,auVar46);
        fVar93 = auVar46._0_4_;
        auVar127._0_4_ = fVar93 * (float)local_2c8._0_4_;
        fVar194 = auVar46._4_4_;
        auVar127._4_4_ = fVar194 * (float)local_2c8._4_4_;
        fVar196 = auVar46._8_4_;
        auVar127._8_4_ = fVar196 * fStack_2c0;
        fVar198 = auVar46._12_4_;
        auVar127._12_4_ = fVar198 * fStack_2bc;
        auVar140._0_4_ = fVar93 * (float)local_2d8._0_4_;
        auVar140._4_4_ = fVar194 * (float)local_2d8._4_4_;
        auVar140._8_4_ = fVar196 * fStack_2d0;
        auVar140._12_4_ = fVar198 * fStack_2cc;
        auVar146._0_4_ = fVar93 * (float)local_2e8._0_4_;
        auVar146._4_4_ = fVar194 * (float)local_2e8._4_4_;
        auVar146._8_4_ = fVar196 * fStack_2e0;
        auVar146._12_4_ = fVar198 * fStack_2dc;
        auVar112._0_4_ = fVar93 * (float)local_2f8._0_4_;
        auVar112._4_4_ = fVar194 * (float)local_2f8._4_4_;
        auVar112._8_4_ = fVar196 * fStack_2f0;
        auVar112._12_4_ = fVar198 * fStack_2ec;
        auVar46 = vfmadd231ps_fma(auVar127,auVar38,local_288);
        auVar41 = vfmadd231ps_fma(auVar140,auVar38,local_298);
        auVar37 = vfmadd231ps_fma(auVar146,auVar38,local_2a8);
        auVar38 = vfmadd231ps_fma(auVar112,auVar38,local_2b8);
        auVar122._16_16_ = auVar46;
        auVar122._0_16_ = auVar46;
        auVar133._16_16_ = auVar41;
        auVar133._0_16_ = auVar41;
        auVar144._16_16_ = auVar37;
        auVar144._0_16_ = auVar37;
        auVar60 = vpermps_avx512vl(auVar233._0_32_,ZEXT1632(auVar36));
        auVar62 = vsubps_avx(auVar133,auVar122);
        auVar41 = vfmadd213ps_fma(auVar62,auVar60,auVar122);
        auVar62 = vsubps_avx(auVar144,auVar133);
        auVar39 = vfmadd213ps_fma(auVar62,auVar60,auVar133);
        auVar46 = vsubps_avx(auVar38,auVar37);
        auVar134._16_16_ = auVar46;
        auVar134._0_16_ = auVar46;
        auVar46 = vfmadd213ps_fma(auVar134,auVar60,auVar144);
        auVar62 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar41));
        auVar41 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar41));
        auVar62 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar39));
        auVar46 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar39));
        auVar62 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar41));
        auVar56 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar62,auVar60);
        auVar62 = vmulps_avx512vl(auVar62,auVar230._0_32_);
        auVar74._16_16_ = auVar62._16_16_;
        fVar93 = fVar201 * 0.33333334;
        auVar147._0_8_ =
             CONCAT44(auVar56._4_4_ + fVar93 * auVar62._4_4_,auVar56._0_4_ + fVar93 * auVar62._0_4_)
        ;
        auVar147._8_4_ = auVar56._8_4_ + fVar93 * auVar62._8_4_;
        auVar147._12_4_ = auVar56._12_4_ + fVar93 * auVar62._12_4_;
        auVar128._0_4_ = fVar93 * auVar62._16_4_;
        auVar128._4_4_ = fVar93 * auVar62._20_4_;
        auVar128._8_4_ = fVar93 * auVar62._24_4_;
        auVar128._12_4_ = fVar93 * auVar62._28_4_;
        auVar52 = vsubps_avx((undefined1  [16])0x0,auVar128);
        auVar39 = vshufpd_avx(auVar56,auVar56,3);
        auVar40 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar46 = vsubps_avx(auVar39,auVar56);
        auVar41 = vsubps_avx(auVar40,(undefined1  [16])0x0);
        auVar166._0_4_ = auVar46._0_4_ + auVar41._0_4_;
        auVar166._4_4_ = auVar46._4_4_ + auVar41._4_4_;
        auVar166._8_4_ = auVar46._8_4_ + auVar41._8_4_;
        auVar166._12_4_ = auVar46._12_4_ + auVar41._12_4_;
        auVar46 = vshufps_avx(auVar56,auVar56,0xb1);
        auVar41 = vshufps_avx(auVar147,auVar147,0xb1);
        auVar37 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar38 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar218._4_4_ = auVar166._0_4_;
        auVar218._0_4_ = auVar166._0_4_;
        auVar218._8_4_ = auVar166._0_4_;
        auVar218._12_4_ = auVar166._0_4_;
        auVar43 = vshufps_avx(auVar166,auVar166,0x55);
        fVar93 = auVar43._0_4_;
        auVar177._0_4_ = auVar46._0_4_ * fVar93;
        fVar194 = auVar43._4_4_;
        auVar177._4_4_ = auVar46._4_4_ * fVar194;
        fVar196 = auVar43._8_4_;
        auVar177._8_4_ = auVar46._8_4_ * fVar196;
        fVar198 = auVar43._12_4_;
        auVar177._12_4_ = auVar46._12_4_ * fVar198;
        auVar185._0_4_ = auVar41._0_4_ * fVar93;
        auVar185._4_4_ = auVar41._4_4_ * fVar194;
        auVar185._8_4_ = auVar41._8_4_ * fVar196;
        auVar185._12_4_ = auVar41._12_4_ * fVar198;
        auVar204._0_4_ = auVar37._0_4_ * fVar93;
        auVar204._4_4_ = auVar37._4_4_ * fVar194;
        auVar204._8_4_ = auVar37._8_4_ * fVar196;
        auVar204._12_4_ = auVar37._12_4_ * fVar198;
        auVar167._0_4_ = auVar38._0_4_ * fVar93;
        auVar167._4_4_ = auVar38._4_4_ * fVar194;
        auVar167._8_4_ = auVar38._8_4_ * fVar196;
        auVar167._12_4_ = auVar38._12_4_ * fVar198;
        auVar46 = vfmadd231ps_fma(auVar177,auVar218,auVar56);
        auVar41 = vfmadd231ps_fma(auVar185,auVar218,auVar147);
        auVar50 = vfmadd231ps_fma(auVar204,auVar218,auVar52);
        auVar51 = vfmadd231ps_fma(auVar167,(undefined1  [16])0x0,auVar218);
        auVar43 = vshufpd_avx(auVar46,auVar46,1);
        auVar44 = vshufpd_avx(auVar41,auVar41,1);
        auVar48 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar49 = vshufpd_avx512vl(auVar51,auVar51,1);
        in_ZMM17 = ZEXT1664(auVar49);
        auVar37 = vminss_avx(auVar46,auVar41);
        auVar46 = vmaxss_avx(auVar41,auVar46);
        auVar38 = vminss_avx(auVar50,auVar51);
        auVar41 = vmaxss_avx(auVar51,auVar50);
        auVar37 = vminss_avx(auVar37,auVar38);
        auVar46 = vmaxss_avx(auVar41,auVar46);
        auVar38 = vminss_avx(auVar43,auVar44);
        auVar41 = vmaxss_avx(auVar44,auVar43);
        auVar43 = vminss_avx512f(auVar48,auVar49);
        auVar44 = vmaxss_avx512f(auVar49,auVar48);
        auVar41 = vmaxss_avx(auVar44,auVar41);
        auVar38 = vminss_avx512f(auVar38,auVar43);
        fVar194 = auVar41._0_4_;
        fVar93 = auVar46._0_4_;
        if (auVar37._0_4_ < 0.0001) {
          bVar35 = fVar194 == -0.0001;
          bVar32 = NAN(fVar194);
          if (fVar194 <= -0.0001) goto LAB_01a28e91;
          break;
        }
LAB_01a28e91:
        vucomiss_avx512f(auVar38);
        bVar35 = fVar194 <= -0.0001;
        bVar33 = -0.0001 < fVar93;
        bVar32 = bVar35;
        if (!bVar35) break;
        uVar11 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar12 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar25 = (uint)uVar11 & (uint)uVar12;
        bVar23 = (uVar25 & 1) == 0;
        bVar35 = bVar33 && bVar23;
        bVar32 = bVar33 && (uVar25 & 1) == 0;
      } while (!bVar33 || !bVar23);
      auVar50 = vxorps_avx512vl(auVar234._0_16_,auVar234._0_16_);
      vcmpss_avx512f(auVar37,auVar50,1);
      uVar11 = vcmpss_avx512f(auVar46,auVar50,1);
      bVar33 = (bool)((byte)uVar11 & 1);
      auVar74._0_16_ = auVar237._0_16_;
      auVar82._4_28_ = auVar74._4_28_;
      auVar82._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar237._0_4_);
      vucomiss_avx512f(auVar82._0_16_);
      bVar32 = (bool)(!bVar35 | bVar32);
      bVar33 = bVar32 == false;
      auVar84._16_16_ = auVar74._16_16_;
      auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar83._4_28_ = auVar84._4_28_;
      auVar83._0_4_ = (uint)bVar32 * auVar50._0_4_ + (uint)!bVar32 * 0x7f800000;
      auVar44 = auVar83._0_16_;
      auVar86._16_16_ = auVar74._16_16_;
      auVar86._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar85._4_28_ = auVar86._4_28_;
      auVar85._0_4_ = (uint)bVar32 * auVar50._0_4_ + (uint)!bVar32 * -0x800000;
      auVar43 = auVar85._0_16_;
      auVar51 = vxorps_avx512vl(auVar236._0_16_,auVar236._0_16_);
      auVar236 = ZEXT1664(auVar51);
      uVar11 = vcmpss_avx512f(auVar38,auVar50,1);
      bVar35 = (bool)((byte)uVar11 & 1);
      auVar88._16_16_ = auVar74._16_16_;
      auVar88._0_16_ = auVar237._0_16_;
      auVar87._4_28_ = auVar88._4_28_;
      auVar87._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar237._0_4_);
      auVar38 = vucomiss_avx512f(auVar87._0_16_);
      in_ZMM17 = ZEXT1664(auVar38);
      if ((bVar32) || (bVar33)) {
        auVar38 = vucomiss_avx512f(auVar37);
        if ((bVar32) || (bVar33)) {
          auVar50 = vxorps_avx512vl(auVar37,auVar229._0_16_);
          in_ZMM17 = ZEXT1664(auVar50);
          auVar37 = vsubss_avx512f(auVar38,auVar37);
          auVar37 = vdivss_avx512f(auVar50,auVar37);
          auVar38 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
          auVar38 = vfmadd213ss_avx512f(auVar38,auVar51,auVar37);
          auVar37 = auVar38;
        }
        else {
          auVar37 = vxorps_avx512vl(auVar38,auVar38);
          vucomiss_avx512f(auVar37);
          auVar38 = ZEXT416(0x3f800000);
          if ((bVar32) || (bVar33)) {
            auVar38 = SUB6416(ZEXT464(0xff800000),0);
            auVar37 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar44 = vminss_avx512f(auVar44,auVar37);
        auVar43 = vmaxss_avx(auVar38,auVar43);
      }
      auVar237 = ZEXT464(0x3f800000);
      auVar234 = ZEXT1664(local_308);
      uVar11 = vcmpss_avx512f(auVar41,auVar51,1);
      bVar35 = (bool)((byte)uVar11 & 1);
      auVar41 = auVar237._0_16_;
      fVar196 = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * 0x3f800000);
      if ((auVar82._0_4_ != fVar196) || (NAN(auVar82._0_4_) || NAN(fVar196))) {
        if ((fVar194 != fVar93) || (NAN(fVar194) || NAN(fVar93))) {
          auVar46 = vxorps_avx512vl(auVar46,auVar229._0_16_);
          auVar168._0_4_ = auVar46._0_4_ / (fVar194 - fVar93);
          auVar168._4_12_ = auVar46._4_12_;
          auVar46 = vsubss_avx512f(auVar41,auVar168);
          auVar46 = vfmadd213ss_avx512f(auVar46,auVar51,auVar168);
          auVar37 = auVar46;
        }
        else if ((fVar93 != 0.0) ||
                (auVar46 = auVar41, auVar37 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar93))) {
          auVar46 = SUB6416(ZEXT464(0xff800000),0);
          auVar37 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar44 = vminss_avx(auVar44,auVar37);
        auVar43 = vmaxss_avx(auVar46,auVar43);
      }
      bVar35 = auVar87._0_4_ != fVar196;
      auVar46 = vminss_avx512f(auVar44,auVar41);
      auVar90._16_16_ = auVar74._16_16_;
      auVar90._0_16_ = auVar44;
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar35 * auVar46._0_4_ + (uint)!bVar35 * auVar44._0_4_;
      auVar46 = vmaxss_avx512f(auVar41,auVar43);
      auVar92._16_16_ = auVar74._16_16_;
      auVar92._0_16_ = auVar43;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar35 * auVar46._0_4_ + (uint)!bVar35 * auVar43._0_4_;
      auVar46 = vmaxss_avx512f(auVar51,auVar89._0_16_);
      auVar37 = vminss_avx512f(auVar91._0_16_,auVar41);
    } while (auVar37._0_4_ < auVar46._0_4_);
    auVar50 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar46._0_4_ + -0.1)));
    auVar49 = vminss_avx512f(ZEXT416((uint)(auVar37._0_4_ + 0.1)),auVar41);
    auVar113._0_8_ = auVar56._0_8_;
    auVar113._8_8_ = auVar113._0_8_;
    auVar186._8_8_ = auVar147._0_8_;
    auVar186._0_8_ = auVar147._0_8_;
    auVar205._8_8_ = auVar52._0_8_;
    auVar205._0_8_ = auVar52._0_8_;
    auVar46 = vshufpd_avx(auVar147,auVar147,3);
    auVar37 = vshufpd_avx(auVar52,auVar52,3);
    auVar38 = vshufps_avx(auVar50,auVar49,0);
    auVar52 = vsubps_avx512vl(auVar47,auVar38);
    fVar93 = auVar38._0_4_;
    auVar141._0_4_ = fVar93 * auVar39._0_4_;
    fVar194 = auVar38._4_4_;
    auVar141._4_4_ = fVar194 * auVar39._4_4_;
    fVar196 = auVar38._8_4_;
    auVar141._8_4_ = fVar196 * auVar39._8_4_;
    fVar198 = auVar38._12_4_;
    auVar141._12_4_ = fVar198 * auVar39._12_4_;
    auVar148._0_4_ = fVar93 * auVar46._0_4_;
    auVar148._4_4_ = fVar194 * auVar46._4_4_;
    auVar148._8_4_ = fVar196 * auVar46._8_4_;
    auVar148._12_4_ = fVar198 * auVar46._12_4_;
    auVar221._0_4_ = auVar37._0_4_ * fVar93;
    auVar221._4_4_ = auVar37._4_4_ * fVar194;
    auVar221._8_4_ = auVar37._8_4_ * fVar196;
    auVar221._12_4_ = auVar37._12_4_ * fVar198;
    auVar129._0_4_ = fVar93 * auVar40._0_4_;
    auVar129._4_4_ = fVar194 * auVar40._4_4_;
    auVar129._8_4_ = fVar196 * auVar40._8_4_;
    auVar129._12_4_ = fVar198 * auVar40._12_4_;
    auVar40 = vfmadd231ps_fma(auVar141,auVar52,auVar113);
    auVar43 = vfmadd231ps_fma(auVar148,auVar52,auVar186);
    auVar44 = vfmadd231ps_fma(auVar221,auVar52,auVar205);
    auVar52 = vfmadd231ps_fma(auVar129,auVar52,ZEXT816(0));
    auVar37 = vsubss_avx512f(auVar41,auVar50);
    auVar46 = vmovshdup_avx(auVar42);
    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar50._0_4_)),auVar42,auVar37);
    auVar37 = vsubss_avx512f(auVar41,auVar49);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar49._0_4_)),auVar42,auVar37);
    auVar42 = vdivss_avx512f(auVar41,ZEXT416((uint)fVar201));
    auVar46 = vsubps_avx(auVar43,auVar40);
    auVar38 = vmulps_avx512vl(auVar46,auVar45);
    auVar46 = vsubps_avx(auVar44,auVar43);
    auVar39 = vmulps_avx512vl(auVar46,auVar45);
    auVar46 = vsubps_avx(auVar52,auVar44);
    auVar46 = vmulps_avx512vl(auVar46,auVar45);
    auVar37 = vminps_avx(auVar39,auVar46);
    auVar46 = vmaxps_avx(auVar39,auVar46);
    auVar37 = vminps_avx(auVar38,auVar37);
    auVar46 = vmaxps_avx(auVar38,auVar46);
    auVar38 = vshufpd_avx(auVar37,auVar37,3);
    auVar39 = vshufpd_avx(auVar46,auVar46,3);
    auVar37 = vminps_avx(auVar37,auVar38);
    auVar46 = vmaxps_avx(auVar46,auVar39);
    fVar201 = auVar42._0_4_;
    auVar169._0_4_ = auVar37._0_4_ * fVar201;
    auVar169._4_4_ = auVar37._4_4_ * fVar201;
    auVar169._8_4_ = auVar37._8_4_ * fVar201;
    auVar169._12_4_ = auVar37._12_4_ * fVar201;
    auVar157._0_4_ = fVar201 * auVar46._0_4_;
    auVar157._4_4_ = fVar201 * auVar46._4_4_;
    auVar157._8_4_ = fVar201 * auVar46._8_4_;
    auVar157._12_4_ = fVar201 * auVar46._12_4_;
    auVar50 = vdivss_avx512f(auVar41,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
    auVar46 = vshufpd_avx(auVar40,auVar40,3);
    auVar37 = vshufpd_avx(auVar43,auVar43,3);
    auVar38 = vshufpd_avx(auVar44,auVar44,3);
    auVar39 = vshufpd_avx(auVar52,auVar52,3);
    auVar46 = vsubps_avx(auVar46,auVar40);
    auVar40 = vsubps_avx(auVar37,auVar43);
    auVar42 = vsubps_avx(auVar38,auVar44);
    auVar39 = vsubps_avx(auVar39,auVar52);
    auVar37 = vminps_avx(auVar46,auVar40);
    auVar46 = vmaxps_avx(auVar46,auVar40);
    auVar38 = vminps_avx(auVar42,auVar39);
    auVar38 = vminps_avx(auVar37,auVar38);
    auVar37 = vmaxps_avx(auVar42,auVar39);
    auVar46 = vmaxps_avx(auVar46,auVar37);
    fVar201 = auVar50._0_4_;
    auVar206._0_4_ = fVar201 * auVar38._0_4_;
    auVar206._4_4_ = fVar201 * auVar38._4_4_;
    auVar206._8_4_ = fVar201 * auVar38._8_4_;
    auVar206._12_4_ = fVar201 * auVar38._12_4_;
    auVar187._0_4_ = fVar201 * auVar46._0_4_;
    auVar187._4_4_ = fVar201 * auVar46._4_4_;
    auVar187._8_4_ = fVar201 * auVar46._8_4_;
    auVar187._12_4_ = fVar201 * auVar46._12_4_;
    auVar39 = vinsertps_avx(auVar36,auVar48,0x10);
    auVar53 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9f90,auVar49);
    auVar103._0_4_ = auVar39._0_4_ + auVar53._0_4_;
    auVar103._4_4_ = auVar39._4_4_ + auVar53._4_4_;
    auVar103._8_4_ = auVar39._8_4_ + auVar53._8_4_;
    auVar103._12_4_ = auVar39._12_4_ + auVar53._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar52 = vmulps_avx512vl(auVar103,auVar15);
    auVar37 = vshufps_avx(auVar52,auVar52,0x54);
    uVar94 = auVar52._0_4_;
    auVar106._4_4_ = uVar94;
    auVar106._0_4_ = uVar94;
    auVar106._8_4_ = uVar94;
    auVar106._12_4_ = uVar94;
    auVar42 = vfmadd213ps_avx512vl(auVar235._0_16_,auVar106,local_308);
    auVar38 = vfmadd213ps_fma(local_e8,auVar106,local_268);
    auVar40 = vfmadd213ps_fma(local_f8,auVar106,local_278);
    auVar46 = vsubps_avx(auVar38,auVar42);
    auVar42 = vfmadd213ps_fma(auVar46,auVar106,auVar42);
    auVar46 = vsubps_avx(auVar40,auVar38);
    auVar46 = vfmadd213ps_fma(auVar46,auVar106,auVar38);
    auVar46 = vsubps_avx(auVar46,auVar42);
    auVar38 = vfmadd231ps_fma(auVar42,auVar46,auVar106);
    auVar43 = vmulps_avx512vl(auVar46,auVar45);
    auVar213._8_8_ = auVar38._0_8_;
    auVar213._0_8_ = auVar38._0_8_;
    auVar46 = vshufpd_avx(auVar38,auVar38,3);
    auVar38 = vshufps_avx(auVar52,auVar52,0x55);
    auVar40 = vsubps_avx(auVar46,auVar213);
    auVar42 = vfmadd231ps_fma(auVar213,auVar38,auVar40);
    auVar222._8_8_ = auVar43._0_8_;
    auVar222._0_8_ = auVar43._0_8_;
    auVar46 = vshufpd_avx(auVar43,auVar43,3);
    auVar46 = vsubps_avx512vl(auVar46,auVar222);
    auVar46 = vfmadd213ps_avx512vl(auVar46,auVar38,auVar222);
    auVar107._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar107._8_4_ = auVar40._8_4_ ^ 0x80000000;
    auVar107._12_4_ = auVar40._12_4_ ^ 0x80000000;
    auVar38 = vmovshdup_avx512vl(auVar46);
    auVar223._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    auVar223._8_4_ = auVar38._8_4_ ^ 0x80000000;
    auVar223._12_4_ = auVar38._12_4_ ^ 0x80000000;
    auVar43 = vmovshdup_avx512vl(auVar40);
    auVar44 = vpermt2ps_avx512vl(auVar223,ZEXT416(5),auVar40);
    auVar234 = ZEXT1664(local_308);
    auVar38 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar40._0_4_)),auVar46,auVar43);
    auVar40 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar107);
    auVar130._0_4_ = auVar38._0_4_;
    auVar130._4_4_ = auVar130._0_4_;
    auVar130._8_4_ = auVar130._0_4_;
    auVar130._12_4_ = auVar130._0_4_;
    auVar46 = vdivps_avx(auVar44,auVar130);
    auVar54 = vdivps_avx512vl(auVar40,auVar130);
    fVar201 = auVar42._0_4_;
    auVar38 = vshufps_avx(auVar42,auVar42,0x55);
    auVar214._0_4_ = fVar201 * auVar46._0_4_ + auVar38._0_4_ * auVar54._0_4_;
    auVar214._4_4_ = fVar201 * auVar46._4_4_ + auVar38._4_4_ * auVar54._4_4_;
    auVar214._8_4_ = fVar201 * auVar46._8_4_ + auVar38._8_4_ * auVar54._8_4_;
    auVar214._12_4_ = fVar201 * auVar46._12_4_ + auVar38._12_4_ * auVar54._12_4_;
    auVar50 = vsubps_avx(auVar37,auVar214);
    auVar38 = vmovshdup_avx(auVar46);
    auVar37 = vinsertps_avx(auVar169,auVar206,0x1c);
    auVar224._0_4_ = auVar38._0_4_ * auVar37._0_4_;
    auVar224._4_4_ = auVar38._4_4_ * auVar37._4_4_;
    auVar224._8_4_ = auVar38._8_4_ * auVar37._8_4_;
    auVar224._12_4_ = auVar38._12_4_ * auVar37._12_4_;
    auVar56 = vinsertps_avx512f(auVar157,auVar187,0x1c);
    auVar38 = vmulps_avx512vl(auVar38,auVar56);
    auVar44 = vminps_avx512vl(auVar224,auVar38);
    auVar42 = vmaxps_avx(auVar38,auVar224);
    auVar43 = vmovshdup_avx(auVar54);
    auVar38 = vinsertps_avx(auVar206,auVar169,0x4c);
    auVar207._0_4_ = auVar43._0_4_ * auVar38._0_4_;
    auVar207._4_4_ = auVar43._4_4_ * auVar38._4_4_;
    auVar207._8_4_ = auVar43._8_4_ * auVar38._8_4_;
    auVar207._12_4_ = auVar43._12_4_ * auVar38._12_4_;
    auVar40 = vinsertps_avx(auVar187,auVar157,0x4c);
    auVar188._0_4_ = auVar43._0_4_ * auVar40._0_4_;
    auVar188._4_4_ = auVar43._4_4_ * auVar40._4_4_;
    auVar188._8_4_ = auVar43._8_4_ * auVar40._8_4_;
    auVar188._12_4_ = auVar43._12_4_ * auVar40._12_4_;
    auVar43 = vminps_avx(auVar207,auVar188);
    auVar44 = vaddps_avx512vl(auVar44,auVar43);
    auVar43 = vmaxps_avx(auVar188,auVar207);
    auVar189._0_4_ = auVar42._0_4_ + auVar43._0_4_;
    auVar189._4_4_ = auVar42._4_4_ + auVar43._4_4_;
    auVar189._8_4_ = auVar42._8_4_ + auVar43._8_4_;
    auVar189._12_4_ = auVar42._12_4_ + auVar43._12_4_;
    auVar208._8_8_ = 0x3f80000000000000;
    auVar208._0_8_ = 0x3f80000000000000;
    auVar42 = vsubps_avx(auVar208,auVar189);
    auVar43 = vsubps_avx(auVar208,auVar44);
    auVar44 = vsubps_avx(auVar39,auVar52);
    auVar52 = vsubps_avx(auVar53,auVar52);
    fVar198 = auVar44._0_4_;
    auVar225._0_4_ = fVar198 * auVar42._0_4_;
    fVar199 = auVar44._4_4_;
    auVar225._4_4_ = fVar199 * auVar42._4_4_;
    fVar200 = auVar44._8_4_;
    auVar225._8_4_ = fVar200 * auVar42._8_4_;
    fVar102 = auVar44._12_4_;
    auVar225._12_4_ = fVar102 * auVar42._12_4_;
    auVar55 = vbroadcastss_avx512vl(auVar46);
    auVar37 = vmulps_avx512vl(auVar55,auVar37);
    auVar56 = vmulps_avx512vl(auVar55,auVar56);
    auVar55 = vminps_avx512vl(auVar37,auVar56);
    auVar56 = vmaxps_avx512vl(auVar56,auVar37);
    auVar37 = vbroadcastss_avx512vl(auVar54);
    auVar38 = vmulps_avx512vl(auVar37,auVar38);
    auVar37 = vmulps_avx512vl(auVar37,auVar40);
    auVar40 = vminps_avx512vl(auVar38,auVar37);
    auVar40 = vaddps_avx512vl(auVar55,auVar40);
    auVar44 = vmulps_avx512vl(auVar44,auVar43);
    in_ZMM17 = ZEXT1664(auVar44);
    fVar201 = auVar52._0_4_;
    auVar190._0_4_ = fVar201 * auVar42._0_4_;
    fVar93 = auVar52._4_4_;
    auVar190._4_4_ = fVar93 * auVar42._4_4_;
    fVar194 = auVar52._8_4_;
    auVar190._8_4_ = fVar194 * auVar42._8_4_;
    fVar196 = auVar52._12_4_;
    auVar190._12_4_ = fVar196 * auVar42._12_4_;
    auVar209._0_4_ = fVar201 * auVar43._0_4_;
    auVar209._4_4_ = fVar93 * auVar43._4_4_;
    auVar209._8_4_ = fVar194 * auVar43._8_4_;
    auVar209._12_4_ = fVar196 * auVar43._12_4_;
    auVar37 = vmaxps_avx(auVar37,auVar38);
    auVar158._0_4_ = auVar56._0_4_ + auVar37._0_4_;
    auVar158._4_4_ = auVar56._4_4_ + auVar37._4_4_;
    auVar158._8_4_ = auVar56._8_4_ + auVar37._8_4_;
    auVar158._12_4_ = auVar56._12_4_ + auVar37._12_4_;
    auVar170._8_8_ = 0x3f800000;
    auVar170._0_8_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar170,auVar158);
    auVar38 = vsubps_avx512vl(auVar170,auVar40);
    auVar219._0_4_ = fVar198 * auVar37._0_4_;
    auVar219._4_4_ = fVar199 * auVar37._4_4_;
    auVar219._8_4_ = fVar200 * auVar37._8_4_;
    auVar219._12_4_ = fVar102 * auVar37._12_4_;
    auVar215._0_4_ = fVar198 * auVar38._0_4_;
    auVar215._4_4_ = fVar199 * auVar38._4_4_;
    auVar215._8_4_ = fVar200 * auVar38._8_4_;
    auVar215._12_4_ = fVar102 * auVar38._12_4_;
    auVar159._0_4_ = fVar201 * auVar37._0_4_;
    auVar159._4_4_ = fVar93 * auVar37._4_4_;
    auVar159._8_4_ = fVar194 * auVar37._8_4_;
    auVar159._12_4_ = fVar196 * auVar37._12_4_;
    auVar171._0_4_ = fVar201 * auVar38._0_4_;
    auVar171._4_4_ = fVar93 * auVar38._4_4_;
    auVar171._8_4_ = fVar194 * auVar38._8_4_;
    auVar171._12_4_ = fVar196 * auVar38._12_4_;
    auVar37 = vminps_avx(auVar219,auVar215);
    auVar38 = vminps_avx512vl(auVar159,auVar171);
    auVar40 = vminps_avx512vl(auVar37,auVar38);
    auVar37 = vmaxps_avx(auVar215,auVar219);
    auVar38 = vmaxps_avx(auVar171,auVar159);
    auVar38 = vmaxps_avx(auVar38,auVar37);
    auVar42 = vminps_avx512vl(auVar225,auVar44);
    auVar37 = vminps_avx(auVar190,auVar209);
    auVar37 = vminps_avx(auVar42,auVar37);
    auVar37 = vhaddps_avx(auVar40,auVar37);
    auVar42 = vmaxps_avx512vl(auVar44,auVar225);
    auVar40 = vmaxps_avx(auVar209,auVar190);
    auVar40 = vmaxps_avx(auVar40,auVar42);
    auVar38 = vhaddps_avx(auVar38,auVar40);
    auVar37 = vshufps_avx(auVar37,auVar37,0xe8);
    auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
    auVar160._0_4_ = auVar37._0_4_ + auVar50._0_4_;
    auVar160._4_4_ = auVar37._4_4_ + auVar50._4_4_;
    auVar160._8_4_ = auVar37._8_4_ + auVar50._8_4_;
    auVar160._12_4_ = auVar37._12_4_ + auVar50._12_4_;
    auVar172._0_4_ = auVar38._0_4_ + auVar50._0_4_;
    auVar172._4_4_ = auVar38._4_4_ + auVar50._4_4_;
    auVar172._8_4_ = auVar38._8_4_ + auVar50._8_4_;
    auVar172._12_4_ = auVar38._12_4_ + auVar50._12_4_;
    auVar37 = vmaxps_avx(auVar39,auVar160);
    auVar38 = vminps_avx(auVar172,auVar53);
    uVar1 = vcmpps_avx512vl(auVar38,auVar37,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar172,auVar53,1);
  uVar11 = vcmpps_avx512vl(auVar36,auVar160,1);
  if (((ushort)uVar11 & (ushort)uVar1 & 1) == 0) {
    bVar24 = 0;
  }
  else {
    auVar37 = vmovshdup_avx(auVar160);
    bVar24 = auVar48._0_4_ < auVar37._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar26 || uVar6 != 0 && !bVar34) | bVar24) != 1) goto LAB_01a29b18;
  lVar28 = 0xc9;
  do {
    lVar28 = lVar28 + -1;
    if (lVar28 == 0) goto LAB_01a28c64;
    auVar36 = vsubss_avx512f(auVar41,auVar50);
    fVar194 = auVar36._0_4_;
    fVar201 = fVar194 * fVar194 * fVar194;
    fVar196 = auVar50._0_4_;
    fVar93 = fVar196 * 3.0 * fVar194 * fVar194;
    fVar194 = fVar194 * fVar196 * fVar196 * 3.0;
    auVar119._4_4_ = fVar201;
    auVar119._0_4_ = fVar201;
    auVar119._8_4_ = fVar201;
    auVar119._12_4_ = fVar201;
    auVar114._4_4_ = fVar93;
    auVar114._0_4_ = fVar93;
    auVar114._8_4_ = fVar93;
    auVar114._12_4_ = fVar93;
    auVar96._4_4_ = fVar194;
    auVar96._0_4_ = fVar194;
    auVar96._8_4_ = fVar194;
    auVar96._12_4_ = fVar194;
    fVar196 = fVar196 * fVar196 * fVar196;
    auVar142._0_4_ = (float)local_108._0_4_ * fVar196;
    auVar142._4_4_ = (float)local_108._4_4_ * fVar196;
    auVar142._8_4_ = fStack_100 * fVar196;
    auVar142._12_4_ = fStack_fc * fVar196;
    auVar36 = vfmadd231ps_fma(auVar142,local_278,auVar96);
    auVar36 = vfmadd231ps_fma(auVar36,local_268,auVar114);
    auVar36 = vfmadd231ps_avx512vl(auVar36,local_308,auVar119);
    auVar97._8_8_ = auVar36._0_8_;
    auVar97._0_8_ = auVar36._0_8_;
    auVar36 = vshufpd_avx(auVar36,auVar36,3);
    auVar37 = vshufps_avx(auVar50,auVar50,0x55);
    auVar36 = vsubps_avx(auVar36,auVar97);
    auVar37 = vfmadd213ps_fma(auVar36,auVar37,auVar97);
    fVar201 = auVar37._0_4_;
    auVar36 = vshufps_avx(auVar37,auVar37,0x55);
    auVar98._0_4_ = auVar46._0_4_ * fVar201 + auVar54._0_4_ * auVar36._0_4_;
    auVar98._4_4_ = auVar46._4_4_ * fVar201 + auVar54._4_4_ * auVar36._4_4_;
    auVar98._8_4_ = auVar46._8_4_ * fVar201 + auVar54._8_4_ * auVar36._8_4_;
    auVar98._12_4_ = auVar46._12_4_ * fVar201 + auVar54._12_4_ * auVar36._12_4_;
    auVar50 = vsubps_avx(auVar50,auVar98);
    auVar36 = vandps_avx512vl(auVar37,auVar228._0_16_);
    auVar37 = vprolq_avx512vl(auVar36,0x20);
    auVar36 = vmaxss_avx(auVar37,auVar36);
    bVar34 = (float)local_118._0_4_ < auVar36._0_4_;
  } while ((float)local_118._0_4_ <= auVar36._0_4_);
  auVar36 = vucomiss_avx512f(auVar51);
  if (bVar34) goto LAB_01a28c64;
  auVar46 = vucomiss_avx512f(auVar36);
  auVar237 = ZEXT1664(auVar46);
  if (bVar34) goto LAB_01a28c64;
  vmovshdup_avx(auVar36);
  auVar46 = vucomiss_avx512f(auVar51);
  if (bVar34) goto LAB_01a28c64;
  auVar41 = vucomiss_avx512f(auVar46);
  auVar237 = ZEXT1664(auVar41);
  if (bVar34) goto LAB_01a28c64;
  auVar37 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar52 = vinsertps_avx(auVar37,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar37 = vsubps_avx(local_1a8,(undefined1  [16])aVar2);
  auVar37 = vdpps_avx(auVar37,auVar52,0x7f);
  auVar38 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
  auVar38 = vdpps_avx(auVar38,auVar52,0x7f);
  auVar39 = vsubps_avx(local_1f8,(undefined1  [16])aVar2);
  auVar39 = vdpps_avx(auVar39,auVar52,0x7f);
  auVar40 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
  auVar40 = vdpps_avx(auVar40,auVar52,0x7f);
  auVar42 = vsubps_avx(_local_1b8,(undefined1  [16])aVar2);
  auVar42 = vdpps_avx(auVar42,auVar52,0x7f);
  auVar43 = vsubps_avx(_local_208,(undefined1  [16])aVar2);
  auVar43 = vdpps_avx(auVar43,auVar52,0x7f);
  auVar44 = vsubps_avx(_local_218,(undefined1  [16])aVar2);
  auVar44 = vdpps_avx(auVar44,auVar52,0x7f);
  auVar50 = vsubps_avx(_local_1d8,(undefined1  [16])aVar2);
  auVar52 = vdpps_avx(auVar50,auVar52,0x7f);
  auVar50 = vsubss_avx512f(auVar41,auVar46);
  fVar201 = auVar46._0_4_;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar201)),auVar50,auVar37);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar201)),auVar50,auVar38);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar201)),auVar50,auVar39);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar52._0_4_)),auVar50,auVar40);
  auVar41 = vsubss_avx512f(auVar41,auVar36);
  auVar143._0_4_ = auVar41._0_4_;
  fVar201 = auVar143._0_4_ * auVar143._0_4_ * auVar143._0_4_;
  fVar198 = auVar36._0_4_;
  fVar93 = fVar198 * 3.0 * auVar143._0_4_ * auVar143._0_4_;
  fVar194 = auVar143._0_4_ * fVar198 * fVar198 * 3.0;
  fVar199 = fVar198 * fVar198 * fVar198;
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * auVar39._0_4_)),ZEXT416((uint)fVar194),auVar38)
  ;
  auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar93),auVar37);
  auVar46 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar201),auVar46);
  fVar196 = auVar46._0_4_;
  if ((fVar196 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (local_33c = (ray->super_RayK<1>).tfar, local_33c < fVar196)) goto LAB_01a28c64;
  auVar46 = vshufps_avx(auVar36,auVar36,0x55);
  auVar37 = vsubps_avx512vl(auVar47,auVar46);
  fVar200 = auVar46._0_4_;
  auVar173._0_4_ = fVar200 * (float)local_1b8._0_4_;
  fVar102 = auVar46._4_4_;
  auVar173._4_4_ = fVar102 * (float)local_1b8._4_4_;
  fVar104 = auVar46._8_4_;
  auVar173._8_4_ = fVar104 * fStack_1b0;
  fVar99 = auVar46._12_4_;
  auVar173._12_4_ = fVar99 * fStack_1ac;
  auVar178._0_4_ = fVar200 * (float)local_208._0_4_;
  auVar178._4_4_ = fVar102 * (float)local_208._4_4_;
  auVar178._8_4_ = fVar104 * fStack_200;
  auVar178._12_4_ = fVar99 * fStack_1fc;
  auVar191._0_4_ = fVar200 * (float)local_218._0_4_;
  auVar191._4_4_ = fVar102 * (float)local_218._4_4_;
  auVar191._8_4_ = fVar104 * fStack_210;
  auVar191._12_4_ = fVar99 * fStack_20c;
  auVar149._0_4_ = fVar200 * (float)local_1d8._0_4_;
  auVar149._4_4_ = fVar102 * (float)local_1d8._4_4_;
  auVar149._8_4_ = fVar104 * fStack_1d0;
  auVar149._12_4_ = fVar99 * fStack_1cc;
  auVar46 = vfmadd231ps_fma(auVar173,auVar37,local_1a8);
  auVar47 = vfmadd231ps_fma(auVar178,auVar37,local_1e8);
  auVar41 = vfmadd231ps_fma(auVar191,auVar37,local_1f8);
  auVar37 = vfmadd231ps_fma(auVar149,auVar37,local_1c8);
  auVar46 = vsubps_avx(auVar47,auVar46);
  auVar47 = vsubps_avx(auVar41,auVar47);
  auVar41 = vsubps_avx(auVar37,auVar41);
  auVar192._0_4_ = fVar198 * auVar47._0_4_;
  auVar192._4_4_ = fVar198 * auVar47._4_4_;
  auVar192._8_4_ = fVar198 * auVar47._8_4_;
  auVar192._12_4_ = fVar198 * auVar47._12_4_;
  auVar143._4_4_ = auVar143._0_4_;
  auVar143._8_4_ = auVar143._0_4_;
  auVar143._12_4_ = auVar143._0_4_;
  auVar46 = vfmadd231ps_fma(auVar192,auVar143,auVar46);
  auVar150._0_4_ = fVar198 * auVar41._0_4_;
  auVar150._4_4_ = fVar198 * auVar41._4_4_;
  auVar150._8_4_ = fVar198 * auVar41._8_4_;
  auVar150._12_4_ = fVar198 * auVar41._12_4_;
  auVar47 = vfmadd231ps_fma(auVar150,auVar143,auVar47);
  auVar151._0_4_ = fVar198 * auVar47._0_4_;
  auVar151._4_4_ = fVar198 * auVar47._4_4_;
  auVar151._8_4_ = fVar198 * auVar47._8_4_;
  auVar151._12_4_ = fVar198 * auVar47._12_4_;
  auVar46 = vfmadd231ps_fma(auVar151,auVar143,auVar46);
  auVar45 = vmulps_avx512vl(auVar46,auVar45);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_01a28c64;
  auVar131._0_4_ = fVar199 * (float)local_158._0_4_;
  auVar131._4_4_ = fVar199 * (float)local_158._4_4_;
  auVar131._8_4_ = fVar199 * fStack_150;
  auVar131._12_4_ = fVar199 * fStack_14c;
  auVar120._4_4_ = fVar194;
  auVar120._0_4_ = fVar194;
  auVar120._8_4_ = fVar194;
  auVar120._12_4_ = fVar194;
  auVar46 = vfmadd132ps_fma(auVar120,auVar131,local_148);
  auVar115._4_4_ = fVar93;
  auVar115._0_4_ = fVar93;
  auVar115._8_4_ = fVar93;
  auVar115._12_4_ = fVar93;
  auVar46 = vfmadd132ps_fma(auVar115,auVar46,local_138);
  auVar108._4_4_ = fVar201;
  auVar108._0_4_ = fVar201;
  auVar108._8_4_ = fVar201;
  auVar108._12_4_ = fVar201;
  auVar41 = vfmadd132ps_fma(auVar108,auVar46,local_128);
  auVar46 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar109._0_4_ = auVar41._0_4_ * auVar47._0_4_;
  auVar109._4_4_ = auVar41._4_4_ * auVar47._4_4_;
  auVar109._8_4_ = auVar41._8_4_ * auVar47._8_4_;
  auVar109._12_4_ = auVar41._12_4_ * auVar47._12_4_;
  auVar46 = vfmsub231ps_fma(auVar109,auVar45,auVar46);
  auVar45 = vshufps_avx(auVar46,auVar46,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar196;
    uVar11 = vmovlps_avx(auVar45);
    *(undefined8 *)&(ray->Ng).field_0 = uVar11;
    (ray->Ng).field_0.field_0.z = auVar46._0_4_;
    uVar11 = vmovlps_avx(auVar36);
    ray->u = (float)(int)uVar11;
    ray->v = (float)(int)((ulong)uVar11 >> 0x20);
    ray->primID = (uint)local_310;
    ray->geomID = uVar5;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_01a28c64;
  }
  local_188 = vmovlps_avx(auVar45);
  local_180 = auVar46._0_4_;
  local_17c = vmovlps_avx(auVar36);
  local_174 = (uint)local_310;
  local_170 = uVar5;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar196;
  local_340 = -1;
  local_248.valid = &local_340;
  local_248.geometryUserPtr = pGVar7->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    local_250 = context;
    (*pGVar7->intersectionFilterN)(&local_248);
    auVar235 = ZEXT1664(local_338);
    auVar237 = ZEXT464(0x3f800000);
    auVar233 = ZEXT3264(_DAT_01fb9fe0);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar232 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar231 = ZEXT1664(auVar36);
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar62);
    auVar74._16_16_ = auVar62._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar229 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar228 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar227 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
    auVar238 = ZEXT1664(auVar36);
    context = local_250;
    if (*local_248.valid == 0) goto LAB_01a29b07;
  }
  p_Var10 = context->args->filter;
  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var10)(&local_248);
    auVar235 = ZEXT1664(local_338);
    auVar237 = ZEXT464(0x3f800000);
    auVar233 = ZEXT3264(_DAT_01fb9fe0);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar232 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar231 = ZEXT1664(auVar36);
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar62);
    auVar74._16_16_ = auVar62._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar229 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar228 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar227 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
    auVar238 = ZEXT1664(auVar36);
    if (*local_248.valid == 0) {
LAB_01a29b07:
      auVar237 = ZEXT464(0x3f800000);
      (ray->super_RayK<1>).tfar = local_33c;
      goto LAB_01a28c64;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_01a28c64;
LAB_01a29b18:
  auVar42 = vinsertps_avx(auVar48,auVar49,0x10);
  goto LAB_01a28767;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }